

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::_::ArrayJoinPromiseNodeBase::Branch::~Branch(Branch *this)

{
  PromiseArenaMember *node;
  
  node = &((this->dependency).ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->dependency).ptr = (PromiseNode *)0x0;
    PromiseDisposer::dispose(node);
  }
  Event::~Event(&this->super_Event);
  return;
}

Assistant:

ArrayJoinPromiseNodeBase::Branch::~Branch() noexcept(false) {}